

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zetKernelGetProfileInfo
          (zet_kernel_handle_t hKernel,zet_profile_properties_t *pProfileProperties)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  ze_result_t unaff_EBP;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ze_result_t local_94;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zetKernelGetProfileInfo(hKernel, pProfileProperties)","");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(context + 0x728);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(context + 0xd30);
    lVar3 = *(long *)(context + 0xd38);
    uVar8 = lVar3 - lVar6 >> 3;
    bVar9 = lVar3 != lVar6;
    local_94 = unaff_EBP;
    if (bVar9) {
      uVar7 = 1;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(context + 0xd30) + -8 + uVar7 * 8) + 0x10);
        local_94 = (**(code **)(*plVar4 + 0x210))(plVar4,hKernel,pProfileProperties);
        if (local_94 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zetKernelGetProfileInfo",local_94);
          break;
        }
        bVar9 = uVar7 < uVar8;
        lVar1 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
        local_94 = unaff_EBP;
      } while (lVar1 != 0);
    }
    lVar1 = context;
    if (bVar9) {
      return local_94;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar5 = ZETHandleLifetimeValidation::zetKernelGetProfileInfoPrologue
                          ((ZETHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 0x10),
                           hKernel,pProfileProperties), zVar5 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zetKernelGetProfileInfo",zVar5);
      return zVar5;
    }
    zVar5 = (*pcVar2)(hKernel,pProfileProperties);
    bVar9 = lVar3 != lVar6;
    if (bVar9) {
      uVar7 = 1;
      do {
        plVar4 = *(long **)(*(long *)(*(long *)(lVar1 + 0xd30) + -8 + uVar7 * 8) + 0x10);
        result = (**(code **)(*plVar4 + 0x218))(plVar4,hKernel,pProfileProperties,zVar5);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zetKernelGetProfileInfo",result);
          local_94 = result;
          break;
        }
        bVar9 = uVar7 < uVar8;
        lVar6 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar6 != 0);
    }
    if (bVar9) {
      return local_94;
    }
  }
  logAndPropagateResult("zetKernelGetProfileInfo",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetKernelGetProfileInfo(
        zet_kernel_handle_t hKernel,                    ///< [in] handle to kernel
        zet_profile_properties_t* pProfileProperties    ///< [out] pointer to profile properties
        )
    {
        context.logger->log_trace("zetKernelGetProfileInfo(hKernel, pProfileProperties)");

        auto pfnGetProfileInfo = context.zetDdiTable.Kernel.pfnGetProfileInfo;

        if( nullptr == pfnGetProfileInfo )
            return logAndPropagateResult("zetKernelGetProfileInfo", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetKernelGetProfileInfoPrologue( hKernel, pProfileProperties );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetKernelGetProfileInfo", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetKernelGetProfileInfoPrologue( hKernel, pProfileProperties );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetKernelGetProfileInfo", result);
        }

        auto driver_result = pfnGetProfileInfo( hKernel, pProfileProperties );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetKernelGetProfileInfoEpilogue( hKernel, pProfileProperties ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetKernelGetProfileInfo", result);
        }

        return logAndPropagateResult("zetKernelGetProfileInfo", driver_result);
    }